

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

SigningResult __thiscall
wallet::DescriptorScriptPubKeyMan::SignMessage
          (DescriptorScriptPubKeyMan *this,string *message,PKHash *pkhash,string *str_sig)

{
  long lVar1;
  bool bVar2;
  SigningResult SVar3;
  long in_FS_OFFSET;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> keys;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_a8;
  undefined1 local_60;
  CKey key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8._16_4_ =
       *(undefined4 *)
        ((pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10);
  local_a8._0_8_ =
       *(undefined8 *)(pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
  ;
  local_a8._8_8_ =
       *(undefined8 *)
        ((pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 8);
  local_60 = 2;
  GetScriptForDestination((CScript *)&key,(CTxDestination *)&local_a8._M_first);
  SVar3 = PRIVATE_KEY_NOT_AVAILABLE;
  GetSigningProvider((DescriptorScriptPubKeyMan *)&keys,(CScript *)this,SUB81(&key,0));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&key);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_a8._M_first);
  if ((__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)
      keys._M_t.
      super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>._M_t.
      super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
      super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)0x0) {
    key.fCompressed = false;
    key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    ToKeyID((CKeyID *)&local_a8._M_first,pkhash);
    bVar2 = FlatSigningProvider::GetKey
                      ((FlatSigningProvider *)
                       keys._M_t.
                       super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                       .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl,
                       (CKeyID *)&local_a8._M_first,&key);
    if (bVar2) {
      bVar2 = MessageSign(&key,message,str_sig);
      SVar3 = (uint)!bVar2 * 2;
    }
    else {
      SVar3 = PRIVATE_KEY_NOT_AVAILABLE;
    }
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&key.keydata);
  }
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
            (&keys);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

SigningResult DescriptorScriptPubKeyMan::SignMessage(const std::string& message, const PKHash& pkhash, std::string& str_sig) const
{
    std::unique_ptr<FlatSigningProvider> keys = GetSigningProvider(GetScriptForDestination(pkhash), true);
    if (!keys) {
        return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
    }

    CKey key;
    if (!keys->GetKey(ToKeyID(pkhash), key)) {
        return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
    }

    if (!MessageSign(key, message, str_sig)) {
        return SigningResult::SIGNING_FAILED;
    }
    return SigningResult::OK;
}